

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membuf.c
# Opt level: O3

void raviX_buffer_init(TextBuffer *mb,size_t initial_size)

{
  char *pcVar1;
  
  if (initial_size == 0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)raviX_calloc(1,initial_size);
  }
  mb->buf = pcVar1;
  mb->pos = 0;
  mb->capacity = initial_size;
  return;
}

Assistant:

void raviX_buffer_init(TextBuffer *mb, size_t initial_size)
{
	if (initial_size > 0) {
		mb->buf = (char *)raviX_calloc(1, initial_size);
	} else
		mb->buf = NULL;
	mb->pos = 0;
	mb->capacity = initial_size;
}